

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

void Aig_ManTransferRepr(Aig_Man_t *pNew,Aig_Man_t *pOld)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  Aig_Obj_t **ppAVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  
  if (pNew->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pNew->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0xd7,"void Aig_ManTransferRepr(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar1 = pNew->vObjs->nSize;
  if (pNew->nReprsAlloc < iVar1) {
    ppAVar5 = (Aig_Obj_t **)realloc(pNew->pReprs,(long)iVar1 << 4);
    pNew->pReprs = ppAVar5;
    memset(ppAVar5 + pNew->nReprsAlloc,0,((long)(iVar1 * 2) - (long)pNew->nReprsAlloc) * 8);
    pNew->nReprsAlloc = iVar1 * 2;
  }
  pVVar7 = pOld->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (pOld->pReprs == (Aig_Obj_t **)0x0) {
          __assert_fail("p->pReprs != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                        ,0x85,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (((ulong)pvVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                        ,0x86,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (pOld->nReprsAlloc <= *(int *)((long)pvVar3 + 0x24)) {
          __assert_fail("pNode->Id < p->nReprsAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                        ,0x87,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        pAVar9 = pOld->pReprs[*(int *)((long)pvVar3 + 0x24)];
        if (pAVar9 != (Aig_Obj_t *)0x0) {
          if (pNew->pReprs == (Aig_Obj_t **)0x0) {
            __assert_fail("p->pReprs != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6b,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          pAVar9 = (Aig_Obj_t *)((ulong)(pAVar9->field_5).pData & 0xfffffffffffffffe);
          iVar1 = pAVar9->Id;
          if (pNew->nReprsAlloc <= iVar1) {
            __assert_fail("pNode1->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6e,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          pAVar8 = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 0x28) & 0xfffffffffffffffe);
          iVar2 = pAVar8->Id;
          if (pNew->nReprsAlloc <= iVar2) {
            __assert_fail("pNode2->Id < p->nReprsAlloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                          ,0x6f,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          if (pAVar9 != pAVar8) {
            iVar4 = iVar2;
            if (iVar2 < iVar1) {
              iVar4 = iVar1;
            }
            if (iVar1 < iVar2) {
              pAVar8 = pAVar9;
            }
            pNew->pReprs[iVar4] = pAVar8;
          }
        }
      }
      lVar6 = lVar6 + 1;
      pVVar7 = pOld->vObjs;
    } while (lVar6 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Aig_ManTransferRepr( Aig_Man_t * pNew, Aig_Man_t * pOld )
{
    Aig_Obj_t * pObj, * pRepr;
    int k;
    assert( pNew->pReprs != NULL );
    // extend storage to fix pNew
    if ( pNew->nReprsAlloc < Aig_ManObjNumMax(pNew) )
    {
        int nReprsAllocNew = 2 * Aig_ManObjNumMax(pNew);
        pNew->pReprs = ABC_REALLOC( Aig_Obj_t *, pNew->pReprs, nReprsAllocNew );
        memset( pNew->pReprs + pNew->nReprsAlloc, 0, sizeof(Aig_Obj_t *) * (nReprsAllocNew-pNew->nReprsAlloc) );
        pNew->nReprsAlloc = nReprsAllocNew;
    }
    // go through the nodes which have representatives
    Aig_ManForEachObj( pOld, pObj, k )
        if ( (pRepr = Aig_ObjFindRepr(pOld, pObj)) )
            Aig_ObjSetRepr_( pNew, Aig_Regular((Aig_Obj_t *)pRepr->pData), Aig_Regular((Aig_Obj_t *)pObj->pData) ); 
}